

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_mpi_io.c
# Opt level: O1

int kvtree_read_scatter_map
              (char *prefix,int depth,int *ptr_valid,char **ptr_file,unsigned_long *ptr_offset,
              MPI_Comm comm)

{
  int iVar1;
  char *file;
  unsigned_long pos;
  char **ppcVar2;
  int iVar3;
  uint uVar4;
  ssize_t sVar5;
  kvtree *pkVar6;
  kvtree_elem *elem;
  undefined8 uVar7;
  uint uVar8;
  int level_id;
  kvtree *hash;
  int all_valid;
  kvtree *recv;
  kvtree *send;
  unsigned_long newoffset;
  char mappath [1024];
  int local_494;
  kvtree *local_490;
  char *local_488;
  undefined8 local_480;
  kvtree *local_478;
  kvtree *local_470;
  int local_464;
  char *local_460;
  int *local_458;
  char **local_450;
  unsigned_long local_448;
  undefined8 local_440;
  uint local_438 [258];
  
  iVar1 = *ptr_valid;
  file = *ptr_file;
  pos = *ptr_offset;
  local_464 = depth;
  local_460 = prefix;
  local_458 = ptr_valid;
  local_450 = ptr_file;
  local_490 = kvtree_new();
  uVar8 = 0;
  if (iVar1 != 0) {
    iVar3 = kvtree_open(file,0);
    if (iVar3 < 0) {
      kvtree_err("Failed to open file %s @ %s:%d",file,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi_io.c"
                 ,0x19f);
      uVar8 = 1;
    }
    else {
      kvtree_lseek(file,iVar3,pos,0);
      sVar5 = kvtree_read_fd(file,iVar3,local_490);
      if (sVar5 < 0) {
        kvtree_err("Failed to read from %s @ %s:%d",file,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi_io.c"
                   ,0x196);
      }
      uVar8 = (uint)(sVar5 < 0);
      kvtree_close(file,iVar3);
    }
  }
  local_438[0] = (uint)(uVar8 == 0);
  MPI_Allreduce(local_438,&local_480,1,&ompi_mpi_int,&ompi_mpi_op_land,comm);
  uVar4 = 1;
  if ((int)local_480 != 0) {
    local_470 = kvtree_new();
    local_478 = kvtree_new();
    if (iVar1 != 0) {
      pkVar6 = kvtree_get(local_490,"RANK");
      kvtree_merge(local_470,pkVar6);
    }
    uVar7 = 0;
    kvtree_exchange_direction(local_470,local_478,comm,KVTREE_EXCHANGE_RIGHT);
    local_448 = 0;
    elem = kvtree_elem_first(local_478);
    if (elem == (kvtree_elem *)0x0) {
      local_488 = (char *)0x0;
    }
    else {
      pkVar6 = kvtree_elem_hash(elem);
      iVar3 = kvtree_util_get_str(pkVar6,"FILE",(char **)&local_480);
      uVar7 = 1;
      if (iVar3 == 0) {
        snprintf((char *)local_438,0x400,"%s%s",local_460,CONCAT44(local_480._4_4_,(int)local_480));
        local_488 = strdup((char *)local_438);
      }
      else {
        local_488 = (char *)0x0;
        uVar8 = 1;
      }
      iVar3 = kvtree_util_get_bytecount(pkVar6,"OFFSET",&local_448);
      if (iVar3 != 0) {
        uVar8 = 1;
      }
    }
    local_440 = uVar7;
    kvtree_delete(&local_478);
    kvtree_delete(&local_470);
    local_494 = -1;
    if (iVar1 != 0) {
      iVar3 = kvtree_util_get_int(local_490,"LEVEL",&local_494);
      if (iVar3 != 0) {
        uVar8 = 1;
      }
    }
    MPI_Bcast(&local_494,1,&ompi_mpi_int,0,comm);
    local_438[0] = (uint)(uVar8 == 0);
    MPI_Allreduce(local_438,&local_480,1,&ompi_mpi_int,&ompi_mpi_op_land,comm);
    ppcVar2 = local_450;
    uVar4 = 1;
    if ((int)local_480 != 0) {
      if (iVar1 != 0) {
        kvtree_free(local_450);
      }
      *local_458 = (int)local_440;
      *ppcVar2 = local_488;
      *ptr_offset = local_448;
      uVar4 = uVar8;
      if (1 < local_494) {
        uVar4 = kvtree_read_scatter_map(local_460,local_464 + 1,local_458,local_450,ptr_offset,comm)
        ;
      }
    }
  }
  kvtree_delete(&local_490);
  return uVar4;
}

Assistant:

static int kvtree_read_scatter_map(
  const char*     prefix,
  int             depth,
  int*            ptr_valid,
  char**          ptr_file,
  unsigned long*  ptr_offset,
  MPI_Comm        comm)
{
  int rc = KVTREE_SUCCESS;

  /* get local variables so we don't have to deference everything */
  int valid            = *ptr_valid;
  char* file           = *ptr_file;
  unsigned long offset = *ptr_offset;

  /* create a hash to hold section of file */
  kvtree* hash = kvtree_new();

  /* if we can read from file do it */
  if (valid) {
    /* open file if we haven't already */
    int fd = kvtree_open(file, O_RDONLY);
    if (fd >= 0) {
      /* read our segment from the file */
      kvtree_lseek(file, fd, offset, SEEK_SET);
      ssize_t read_rc = kvtree_read_fd(file, fd, hash);
      if (read_rc < 0) {
        kvtree_err("Failed to read from %s @ %s:%d",
          file, __FILE__, __LINE__
        );
        rc = KVTREE_FAILURE;
      }

      /* close the file */
      kvtree_close(file, fd);
    } else {
      kvtree_err("Failed to open file %s @ %s:%d",
        file, __FILE__, __LINE__
      );
      rc = KVTREE_FAILURE;
    }
  }

  /* check for read errors */
  if (! kvtree_alltrue(rc == KVTREE_SUCCESS, comm)) {
    rc = KVTREE_FAILURE;
    goto cleanup;
  }

  /* create hashes to exchange data */
  kvtree* send = kvtree_new();
  kvtree* recv = kvtree_new();

  /* copy rank data into send hash */
  if (valid) {
    kvtree* rank_hash = kvtree_get(hash, "RANK");
    kvtree_merge(send, rank_hash);
  }

  /* exchange hashes */
  kvtree_exchange_direction(send, recv, comm, KVTREE_EXCHANGE_RIGHT);

  /* see if anyone sent us anything */
  int newvalid = 0;
  char* newfile = NULL;
  unsigned long newoffset = 0;
  kvtree_elem* elem = kvtree_elem_first(recv);
  if (elem != NULL) {
    /* got something, so now we'll read in the next step */
    newvalid = 1;

    /* get file name we should read */
    kvtree* elem_hash = kvtree_elem_hash(elem);
    char* value;
    if (kvtree_util_get_str(elem_hash, "FILE", &value) == KVTREE_SUCCESS)
    {
      /* return string of full path to file to caller */
      char mappath[1024];
      snprintf(mappath, sizeof(mappath), "%s%s", prefix, value);
      newfile = strdup(mappath);
    } else {
      rc = KVTREE_FAILURE;
    }

    /* get offset we should start reading from */
    if (kvtree_util_get_bytecount(elem_hash, "OFFSET", &newoffset) != KVTREE_SUCCESS)
    {
      rc = KVTREE_FAILURE;
    }
  }

  /* free the send and receive hashes */
  kvtree_delete(&recv);
  kvtree_delete(&send);

  /* get level id, and broadcast it from rank 0,
   * which we assume to be a reader in all steps */
  int level_id = -1;
  if (valid) {
    if (kvtree_util_get_int(hash, "LEVEL", &level_id) != KVTREE_SUCCESS)
    {
      rc = KVTREE_FAILURE;
    }
  }
  MPI_Bcast(&level_id, 1, MPI_INT, 0, comm);

  /* check for read errors */
  if (! kvtree_alltrue(rc == KVTREE_SUCCESS, comm)) {
    rc = KVTREE_FAILURE;
    goto cleanup;
  }

  /* set parameters for output or next iteration,
   * we already took care of updating ptr_fd earlier */
  if (valid) {
    kvtree_free(ptr_file);
  }
  *ptr_valid  = newvalid;
  *ptr_file   = newfile;
  *ptr_offset = newoffset;

  /* recurse if we still have levels to read */
  if (level_id > 1) {
    rc = kvtree_read_scatter_map(prefix, depth+1, ptr_valid, ptr_file, ptr_offset, comm);
  }

cleanup:
  /* free the hash */
  kvtree_delete(&hash);

  return rc;
}